

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dave.cpp
# Opt level: O1

void __thiscall Enterprise::Dave::Audio::update_channel(Audio *this,int c)

{
  uint16_t uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  
  uVar3 = this->channels_[c].output;
  uVar2 = uVar3 * 2;
  this->channels_[c].output = uVar2;
  if (this->channels_[c].sync == true) {
    this->channels_[c].count = this->channels_[c].reload;
    uVar3 = 0;
  }
  else {
    uVar3 = uVar3 & 1;
    uVar1 = this->channels_[c].count;
    if (uVar1 == 0) {
      this->channels_[c].count = this->channels_[c].reload;
      lVar4 = (long)(int)this->channels_[c].distortion;
      if (lVar4 == 0) {
        uVar3 = uVar3 ^ 1;
      }
      else {
        uVar3 = (uint)this->poly_state_[lVar4];
      }
    }
    else {
      this->channels_[c].count = uVar1 - 1;
    }
    if ((this->channels_[c].high_pass == true) && ((this->channels_[(c + 1) % 3].output & 3U) == 2))
    {
      uVar3 = 0;
    }
  }
  if (this->channels_[c].ring_modulate == true) {
    uVar3 = ~(uVar3 ^ this->channels_[(c + 2) % 3].output) & 1;
  }
  this->channels_[c].output = uVar3 | uVar2;
  return;
}

Assistant:

void Audio::update_channel(int c) {
	auto output = channels_[c].output & 1;
	channels_[c].output <<= 1;
	if(channels_[c].sync) {
		channels_[c].count = channels_[c].reload;
		output = 0;
	} else {
		if(!channels_[c].count) {
			channels_[c].count = channels_[c].reload;

			if(channels_[c].distortion == Channel::Distortion::None)
				output ^= 1;
			else
				output = poly_state_[int(channels_[c].distortion)];
		} else {
			--channels_[c].count;
		}

		if(channels_[c].high_pass && (channels_[(c+1)%3].output&3) == 2) {
			output = 0;
		}
	}

	// Ring modulation applies even when sync is enabled, per SIDBasic.
	if(channels_[c].ring_modulate) {
		output = ~(output ^ channels_[(c+2)%3].output) & 1;
	}

	channels_[c].output |= output;
}